

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix<Complex>::inverseExt(Matrix<Complex> *this,Matrix<Complex> *ext)

{
  Complex *pCVar1;
  uint uVar2;
  uint uVar3;
  matrix_error *this_00;
  long lVar4;
  uint j;
  uint uVar5;
  ulong uVar6;
  uint local_13c;
  Complex local_130;
  Complex coeff;
  
  if (this->N == this->M) {
    if (this->N == ext->M) {
      uVar2 = gauss(this,ext);
      local_13c = uVar2;
      if (uVar2 == this->N) {
        while( true ) {
          local_13c = local_13c - 1;
          uVar5 = uVar2 - 1;
          if (uVar2 == 0) break;
          Complex::Complex(&local_130,1);
          ::operator/(&coeff,&local_130,this->arr + (ulong)(this->N * uVar5) + (ulong)uVar5);
          Complex::~Complex(&local_130);
          lVar4 = 0;
          for (uVar6 = 0; uVar6 < this->N; uVar6 = uVar6 + 1) {
            Complex::operator*=((Complex *)
                                ((long)&this->arr[this->N * local_13c]._re._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4),&coeff);
            lVar4 = lVar4 + 0x80;
          }
          lVar4 = 0;
          for (uVar6 = 0; uVar6 < ext->N; uVar6 = uVar6 + 1) {
            Complex::operator*=((Complex *)
                                ((long)&ext->arr[ext->N * local_13c]._re._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4),&coeff);
            lVar4 = lVar4 + 0x80;
          }
          for (; uVar2 < this->N; uVar2 = uVar2 + 1) {
            uVar3 = this->N * uVar5;
            pCVar1 = this->arr;
            if ((pCVar1[(ulong)uVar3 + (ulong)uVar2]._re._numerator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 pCVar1[(ulong)uVar3 + (ulong)uVar2]._re._numerator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (pCVar1[(ulong)uVar3 + (ulong)uVar2]._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                pCVar1[(ulong)uVar3 + (ulong)uVar2]._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish)) {
              lVar4 = 0;
              for (uVar6 = 0; uVar6 < ext->N; uVar6 = uVar6 + 1) {
                ::operator*(&local_130,
                            (Complex *)
                            ((long)&ext->arr[ext->N * uVar2]._re._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar4),
                            this->arr + (ulong)(this->N * uVar5) + (ulong)uVar2);
                Complex::operator-=((Complex *)
                                    ((long)&ext->arr[ext->N * local_13c]._re._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar4),
                                    &local_130);
                Complex::~Complex(&local_130);
                lVar4 = lVar4 + 0x80;
              }
              Complex::Complex(&local_130);
              Complex::operator=(this->arr + (ulong)(this->N * uVar5) + (ulong)uVar2,&local_130);
              Complex::~Complex(&local_130);
            }
          }
          Complex::~Complex(&coeff);
          uVar2 = uVar5;
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}